

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

ssize_t tnt_object_add_bin(tnt_stream *s,void *bin,uint32_t len)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  ssize_t sVar4;
  undefined1 local_38 [8];
  iovec v [2];
  undefined1 local_e;
  uint local_d;
  char data [6];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  if (len < 0x100) {
    local_e = 0xc4;
    local_d = CONCAT31(local_d._1_3_,(char)len);
    v[0].iov_base = (void *)0x2;
  }
  else if (len < 0x10000) {
    local_e = 0xc5;
    local_d = CONCAT22(local_d._2_2_,(ushort)len << 8 | (ushort)len >> 8);
    v[0].iov_base = (void *)0x3;
  }
  else {
    local_e = 0xc6;
    local_d = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    v[0].iov_base = (void *)0x5;
  }
  local_38 = (undefined1  [8])&local_e;
  v[1].iov_base = (void *)(ulong)len;
  v[0].iov_len = (size_t)bin;
  sVar4 = (*s->writev)(s,(iovec *)local_38,2);
  return sVar4;
}

Assistant:

ssize_t
tnt_object_add_bin (struct tnt_stream *s, const void *bin, uint32_t len)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	struct iovec v[2]; int v_sz = 2;
	char data[6], *end;
	end = mp_encode_binl(data, len);
	v[0].iov_base = data;
	v[0].iov_len  = end - data;
	v[1].iov_base = (void *)bin;
	v[1].iov_len  = len;
	return s->writev(s, v, v_sz);
}